

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O0

FT_Error FT_Outline_Get_Bitmap(FT_Library library,FT_Outline *outline,FT_Bitmap *abitmap)

{
  undefined1 local_88 [8];
  FT_Raster_Params params;
  FT_Bitmap *abitmap_local;
  FT_Outline *outline_local;
  FT_Library library_local;
  
  if (abitmap == (FT_Bitmap *)0x0) {
    library_local._4_4_ = 6;
  }
  else {
    params.source._0_4_ = 0;
    if (((abitmap->pixel_mode == '\x02') || (abitmap->pixel_mode == '\x05')) ||
       (abitmap->pixel_mode == '\x06')) {
      params.source._0_4_ = 1;
    }
    local_88 = (undefined1  [8])abitmap;
    params.clip_box.yMax = (FT_Pos)abitmap;
    library_local._4_4_ = FT_Outline_Render(library,outline,(FT_Raster_Params *)local_88);
  }
  return library_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_Get_Bitmap( FT_Library        library,
                         FT_Outline*       outline,
                         const FT_Bitmap  *abitmap )
  {
    FT_Raster_Params  params;


    if ( !abitmap )
      return FT_THROW( Invalid_Argument );

    /* other checks are delayed to `FT_Outline_Render' */

    params.target = abitmap;
    params.flags  = 0;

    if ( abitmap->pixel_mode == FT_PIXEL_MODE_GRAY  ||
         abitmap->pixel_mode == FT_PIXEL_MODE_LCD   ||
         abitmap->pixel_mode == FT_PIXEL_MODE_LCD_V )
      params.flags |= FT_RASTER_FLAG_AA;

    return FT_Outline_Render( library, outline, &params );
  }